

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selu_x86_fma.cpp
# Opt level: O0

int __thiscall
ncnn::SELU_x86_fma::forward_inplace(SELU_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [24];
  long *in_RSI;
  long in_RDI;
  float fVar42;
  float fVar45;
  float fVar46;
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  float alphaxlambda;
  __m128 _blob_1;
  __m128 _neg_1;
  __m128 _pos_1;
  __m128 _p_1;
  __m128 _lambda128;
  __m128 _alpha128;
  __m128 _one128;
  __m128 _zero128;
  __m256 _blob;
  __m256 _neg;
  __m256 _pos;
  __m256 _p;
  __m256 _lambda256;
  __m256 _alpha256;
  __m256 _one256;
  __m256 _zero256;
  int i;
  float *ptr;
  int q;
  int size;
  int channels;
  int elempack;
  int d;
  int h;
  int w;
  Mat *m;
  __m256 pow2n;
  __m256 y;
  __m256 mask;
  __m256 one;
  __m256i imm0;
  __m256 fx;
  __m256 tmp;
  v4sf pow2n_1;
  v4sf y_1;
  v4sf mask_1;
  v4sf one_1;
  v4si emm0;
  v4sf fx_1;
  v4sf tmp_1;
  imm_xmm_union u_2;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i y2;
  __m128i y1;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  __m256i ret_1;
  __m128i x2_1;
  __m128i x1_1;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 local_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  int local_13f0;
  undefined8 local_13e0;
  undefined8 local_13d8;
  undefined8 local_13d0;
  undefined4 local_13c8;
  long local_13c0;
  undefined4 local_13b8;
  undefined4 local_13b4;
  undefined4 local_13b0;
  undefined4 local_13ac;
  undefined4 local_13a8;
  undefined8 local_13a0;
  undefined1 (*local_1398) [32];
  int local_138c;
  int local_1388;
  int local_1384;
  int local_1380;
  int local_137c;
  int local_1378;
  int local_1374;
  long *local_1368;
  undefined1 local_1355;
  int local_1354;
  undefined8 *local_1348;
  undefined8 *local_1340;
  undefined8 *local_1330;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  uint local_12f4;
  uint local_12f0;
  undefined4 local_12ec;
  undefined1 (*local_12e8) [32];
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined1 local_1240 [8];
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined1 local_1220 [32];
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [8];
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  float local_fc0;
  float fStack_fbc;
  float fStack_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float fStack_fa8;
  float fStack_fa4;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined1 (*local_e98) [32];
  undefined8 local_e90;
  undefined8 uStack_e88;
  float local_e80;
  float fStack_e7c;
  float fStack_e78;
  float fStack_e74;
  float local_e64;
  float local_e60;
  float fStack_e5c;
  float fStack_e58;
  float fStack_e54;
  float local_e44;
  undefined4 local_e40;
  undefined4 uStack_e3c;
  undefined4 uStack_e38;
  undefined4 uStack_e34;
  undefined4 local_e2c;
  undefined1 (*local_e28) [32];
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 local_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 local_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined1 local_dd0 [8];
  undefined8 uStack_dc8;
  undefined1 local_dc0 [16];
  undefined8 local_db0;
  undefined8 uStack_da8;
  undefined1 local_da0 [16];
  undefined1 local_d90 [8];
  undefined8 uStack_d88;
  undefined1 local_d80 [8];
  undefined8 uStack_d78;
  undefined1 local_d70 [16];
  undefined1 local_d60 [16];
  undefined8 local_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 local_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 local_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 local_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 local_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 local_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 local_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  float local_c70;
  float fStack_c6c;
  float fStack_c68;
  float fStack_c64;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 local_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 local_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 local_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 local_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 local_bd0;
  undefined8 uStack_bc8;
  undefined1 (*local_bb8) [32];
  long local_bb0;
  undefined4 local_ba4;
  long local_ba0;
  undefined1 (*local_b98) [32];
  undefined4 local_b8c;
  int local_b88;
  int local_b84;
  undefined8 *local_b80;
  undefined4 local_b74;
  long local_b70;
  undefined8 *local_b50;
  undefined1 local_b20 [16];
  undefined1 auStack_b10 [16];
  undefined4 local_b00;
  undefined4 local_afc;
  undefined4 local_af8;
  undefined4 local_af4;
  undefined4 local_af0;
  undefined4 local_aec;
  undefined4 local_ae8;
  undefined4 local_ae4;
  undefined1 local_ae0 [16];
  undefined1 auStack_ad0 [16];
  uint local_ac0;
  uint local_abc;
  uint local_ab8;
  uint local_ab4;
  uint local_ab0;
  uint local_aac;
  uint local_aa8;
  uint local_aa4;
  undefined1 local_aa0 [32];
  uint local_a68;
  uint local_a64;
  uint local_a60;
  uint local_a5c;
  uint local_a58;
  uint local_a54;
  uint local_a50;
  uint local_a4c;
  undefined1 *local_a48;
  undefined1 *local_a40;
  undefined1 *local_a38;
  float *local_a30;
  undefined1 *local_a28;
  undefined1 *local_a20;
  float *local_a18;
  undefined1 *local_a10;
  undefined1 *local_a08;
  float *local_a00;
  undefined1 *local_9f8;
  undefined1 *local_9f0;
  float *local_9e8;
  undefined1 *local_9e0;
  undefined1 *local_9d8;
  float *local_9d0;
  undefined1 *local_9c8;
  undefined1 *local_9c0;
  float *local_9b8;
  float *local_9b0;
  undefined1 *local_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined1 *local_950;
  float *local_948;
  undefined1 *local_940;
  undefined1 *local_938;
  float *local_930;
  undefined1 *local_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 local_870;
  undefined8 uStack_868;
  undefined1 local_860 [16];
  undefined1 local_850 [16];
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined1 local_790 [16];
  undefined1 local_780 [16];
  undefined4 local_764;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  float local_720 [2];
  float afStack_718 [2];
  float afStack_710 [2];
  float afStack_708 [2];
  float local_700 [2];
  float afStack_6f8 [2];
  float afStack_6f0 [2];
  float afStack_6e8 [2];
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  float local_6c0 [2];
  float afStack_6b8 [2];
  float afStack_6b0 [2];
  float afStack_6a8 [2];
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  float local_660 [2];
  float afStack_658 [2];
  float afStack_650 [2];
  float afStack_648 [2];
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  float local_600 [2];
  float afStack_5f8 [2];
  float afStack_5f0 [2];
  float afStack_5e8 [2];
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  float local_5a0 [2];
  float afStack_598 [2];
  float afStack_590 [2];
  float afStack_588 [2];
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  float local_540 [2];
  float afStack_538 [2];
  float afStack_530 [2];
  float afStack_528 [2];
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  float local_460 [2];
  float afStack_458 [2];
  float afStack_450 [2];
  float afStack_448 [2];
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  float local_400 [2];
  float afStack_3f8 [2];
  float afStack_3f0 [2];
  float afStack_3e8 [2];
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined4 local_344;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined4 local_324;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined4 local_304;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined1 *local_280;
  float *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  float *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  float *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  float *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  float *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  float *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  float *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  float local_1a0 [2];
  float afStack_198 [2];
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  float local_170 [2];
  float afStack_168 [2];
  undefined8 local_160;
  undefined8 uStack_158;
  float local_150 [2];
  float afStack_148 [2];
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  float local_120 [2];
  float afStack_118 [2];
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  float local_f0 [2];
  float afStack_e8 [2];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  float local_c0 [2];
  float afStack_b8 [2];
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  float local_90 [2];
  float afStack_88 [2];
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_1374 = *(int *)((long)in_RSI + 0x2c);
  local_1378 = (int)in_RSI[6];
  local_137c = *(int *)((long)in_RSI + 0x34);
  local_1380 = (int)in_RSI[3];
  local_1384 = (int)in_RSI[7];
  local_1388 = local_1374 * local_1378 * local_137c * local_1380;
  local_1368 = in_RSI;
  for (local_138c = 0; local_138c < local_1384; local_138c = local_138c + 1) {
    local_1348 = &local_13e0;
    local_b84 = *(int *)((long)local_1368 + 0x2c);
    local_b88 = (int)local_1368[6];
    local_b8c = *(undefined4 *)((long)local_1368 + 0x34);
    local_b98 = (undefined1 (*) [32])
                (*local_1368 + local_1368[8] * (long)local_138c * local_1368[2]);
    local_ba0 = local_1368[2];
    local_ba4 = (undefined4)local_1368[3];
    local_bb0 = local_1368[4];
    local_b80 = &local_13e0;
    local_b70 = (long)local_b84 * (long)local_b88 * local_ba0;
    local_1340 = &local_13e0;
    local_1330 = &local_13e0;
    local_b74 = 0x10;
    local_1354 = local_138c;
    local_1355 = 1;
    local_13e0 = 0;
    local_13d0 = 0;
    local_13c8 = 0;
    local_13b8 = 0;
    local_13b4 = 0;
    local_13b0 = 0;
    local_13ac = 0;
    local_13a8 = 0;
    local_13a0 = 0;
    local_13d8 = 0;
    local_13f0 = 0;
    local_1320 = 0;
    uStack_1318 = 0;
    uStack_1310 = 0;
    uStack_1308 = 0;
    local_12ec = 0x3f800000;
    local_ae4 = 0x3f800000;
    local_ae8 = 0x3f800000;
    local_aec = 0x3f800000;
    local_af0 = 0x3f800000;
    local_af4 = 0x3f800000;
    local_af8 = 0x3f800000;
    local_afc = 0x3f800000;
    local_b00 = 0x3f800000;
    auVar1 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x20);
    local_b20 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x30);
    auVar1 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x20);
    auStack_b10 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x30);
    local_12f0 = *(uint *)(in_RDI + 0xd0);
    auVar1 = vinsertps_avx(ZEXT416(local_12f0),ZEXT416(local_12f0),0x10);
    auVar1 = vinsertps_avx(auVar1,ZEXT416(local_12f0),0x20);
    local_ae0 = vinsertps_avx(auVar1,ZEXT416(local_12f0),0x30);
    auVar1 = vinsertps_avx(ZEXT416(local_12f0),ZEXT416(local_12f0),0x10);
    auVar1 = vinsertps_avx(auVar1,ZEXT416(local_12f0),0x20);
    auStack_ad0 = vinsertps_avx(auVar1,ZEXT416(local_12f0),0x30);
    local_12f4 = *(uint *)(in_RDI + 0xd4);
    auVar1 = vinsertps_avx(ZEXT416(local_12f4),ZEXT416(local_12f4),0x10);
    auVar1 = vinsertps_avx(auVar1,ZEXT416(local_12f4),0x20);
    auVar1 = vinsertps_avx(auVar1,ZEXT416(local_12f4),0x30);
    auVar2 = vinsertps_avx(ZEXT416(local_12f4),ZEXT416(local_12f4),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(local_12f4),0x20);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(local_12f4),0x30);
    auVar43._16_16_ = auVar1;
    auVar43._0_16_ = auVar2;
    local_aa0._0_8_ = auVar2._0_8_;
    local_aa0._8_8_ = auVar2._8_8_;
    local_aa0._16_8_ = auVar1._0_8_;
    local_aa0._24_8_ = auVar1._8_8_;
    local_1398 = local_b98;
    for (; local_13f0 + 7 < local_1388; local_13f0 = local_13f0 + 8) {
      local_12e8 = local_1398;
      local_12e0 = *(undefined8 *)*local_1398;
      uStack_12d8 = *(undefined8 *)(*local_1398 + 8);
      uStack_12d0 = *(undefined8 *)(*local_1398 + 0x10);
      uStack_12c8 = *(undefined8 *)(*local_1398 + 0x18);
      local_12c0 = 0;
      uStack_12b8 = 0;
      uStack_12b0 = 0;
      uStack_12a8 = 0;
      auVar4 = vmaxps_avx(ZEXT1632(ZEXT816(0)),*local_1398);
      local_1280 = 0;
      uStack_1278 = 0;
      uStack_1270 = 0;
      uStack_1268 = 0;
      auVar6 = vminps_avx(ZEXT1632(ZEXT816(0)),*local_1398);
      local_14e0 = auVar6._0_8_;
      uStack_14d8 = auVar6._8_8_;
      uStack_14d0 = auVar6._16_8_;
      uStack_14c8 = auVar6._24_8_;
      local_1160 = ZEXT832(0) << 0x20;
      local_1200 = 0x3f8000003f800000;
      uStack_11f8 = 0x3f8000003f800000;
      uStack_11f0 = 0x3f8000003f800000;
      uStack_11e8 = 0x3f8000003f800000;
      local_10e0 = local_14e0;
      uStack_10d8 = uStack_14d8;
      uStack_10d0 = uStack_14d0;
      uStack_10c8 = uStack_14c8;
      local_1100 = 0x42b0c0a542b0c0a5;
      uStack_10f8 = 0x42b0c0a542b0c0a5;
      uStack_10f0 = 0x42b0c0a542b0c0a5;
      uStack_10e8 = 0x42b0c0a542b0c0a5;
      auVar7._8_8_ = 0x42b0c0a542b0c0a5;
      auVar7._0_8_ = 0x42b0c0a542b0c0a5;
      auVar7._16_8_ = 0x42b0c0a542b0c0a5;
      auVar7._24_8_ = 0x42b0c0a542b0c0a5;
      auVar6 = vminps_avx(auVar6,auVar7);
      local_1180._0_8_ = auVar6._0_8_;
      local_1120 = local_1180._0_8_;
      local_1180._8_8_ = auVar6._8_8_;
      uStack_1118 = local_1180._8_8_;
      local_1180._16_8_ = auVar6._16_8_;
      uStack_1110 = local_1180._16_8_;
      local_1180._24_8_ = auVar6._24_8_;
      uStack_1108 = local_1180._24_8_;
      local_1140 = 0xc2b0c0a5c2b0c0a5;
      uStack_1138 = 0xc2b0c0a5c2b0c0a5;
      uStack_1130 = 0xc2b0c0a5c2b0c0a5;
      uStack_1128 = 0xc2b0c0a5c2b0c0a5;
      auVar5._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar5._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar5._16_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar5._24_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar5 = vmaxps_avx(auVar6,auVar5);
      local_a48 = local_1180;
      local_9b0 = ::_ps256_cephes_LOG2EF;
      local_9b8 = ::_ps256_0p5;
      local_1180._0_8_ = auVar5._0_8_;
      local_6e0 = local_1180._0_8_;
      local_1180._8_8_ = auVar5._8_8_;
      uStack_6d8 = local_1180._8_8_;
      local_1180._16_8_ = auVar5._16_8_;
      uStack_6d0 = local_1180._16_8_;
      local_1180._24_8_ = auVar5._24_8_;
      uStack_6c8 = local_1180._24_8_;
      local_700[0] = 1.442695;
      local_700[1] = 1.442695;
      afStack_6f8[0] = 1.442695;
      afStack_6f8[1] = 1.442695;
      afStack_6f0[0] = 1.442695;
      afStack_6f0[1] = 1.442695;
      afStack_6e8[0] = 1.442695;
      afStack_6e8[1] = 1.442695;
      local_720[0] = 0.5;
      local_720[1] = 0.5;
      afStack_718[0] = 0.5;
      afStack_718[1] = 0.5;
      afStack_710[0] = 0.5;
      afStack_710[1] = 0.5;
      afStack_708[0] = 0.5;
      afStack_708[1] = 0.5;
      auVar19._8_4_ = 1.442695;
      auVar19._12_4_ = 1.442695;
      auVar19._0_4_ = 1.442695;
      auVar19._4_4_ = 1.442695;
      auVar19._16_4_ = 1.442695;
      auVar19._20_4_ = 1.442695;
      auVar19._24_4_ = 1.442695;
      auVar19._28_4_ = 1.442695;
      auVar18._8_4_ = 0.5;
      auVar18._12_4_ = 0.5;
      auVar18._0_4_ = 0.5;
      auVar18._4_4_ = 0.5;
      auVar18._16_4_ = 0.5;
      auVar18._20_4_ = 0.5;
      auVar18._24_4_ = 0.5;
      auVar18._28_4_ = 0.5;
      auVar8 = vfmadd213ps_fma(auVar19,auVar5,auVar18);
      auVar7 = vroundps_avx(ZEXT1632(auVar8),1);
      auVar6 = vcmpps_avx(ZEXT1632(auVar8),auVar7,1);
      local_1220._0_8_ = auVar6._0_8_;
      local_980 = local_1220._0_8_;
      local_1220._8_8_ = auVar6._8_8_;
      uStack_978 = local_1220._8_8_;
      local_1220._16_8_ = auVar6._16_8_;
      uStack_970 = local_1220._16_8_;
      local_1220._24_8_ = auVar6._24_8_;
      uStack_968 = local_1220._24_8_;
      local_9a0 = 0x3f8000003f800000;
      uStack_998 = 0x3f8000003f800000;
      uStack_990 = 0x3f8000003f800000;
      uStack_988 = 0x3f8000003f800000;
      auVar44._8_8_ = 0x3f8000003f800000;
      auVar44._0_8_ = 0x3f8000003f800000;
      auVar44._16_8_ = 0x3f8000003f800000;
      auVar44._24_8_ = 0x3f8000003f800000;
      local_1220 = vandps_avx(auVar6,auVar44);
      local_11a0 = auVar7._0_8_;
      local_10a0 = local_11a0;
      uStack_1198 = auVar7._8_8_;
      uStack_1098 = uStack_1198;
      uStack_1190 = auVar7._16_8_;
      uStack_1090 = uStack_1190;
      uStack_1188 = auVar7._24_8_;
      uStack_1088 = uStack_1188;
      local_10c0 = local_1220._0_8_;
      uStack_10b8 = local_1220._8_8_;
      uStack_10b0 = local_1220._16_8_;
      uStack_10a8 = local_1220._24_8_;
      local_11c0 = vsubps_avx(auVar7,local_1220);
      local_940 = local_11c0;
      local_930 = ::_ps256_cephes_exp_C1;
      local_440 = local_11c0._0_8_;
      uStack_438 = local_11c0._8_8_;
      uStack_430 = local_11c0._16_8_;
      uStack_428 = local_11c0._24_8_;
      local_460[0] = 0.6933594;
      local_460[1] = 0.6933594;
      afStack_458[0] = 0.6933594;
      afStack_458[1] = 0.6933594;
      afStack_450[0] = 0.6933594;
      afStack_450[1] = 0.6933594;
      afStack_448[0] = 0.6933594;
      afStack_448[1] = 0.6933594;
      local_480 = local_1180._0_8_;
      uStack_478 = local_1180._8_8_;
      uStack_470 = local_1180._16_8_;
      uStack_468 = local_1180._24_8_;
      auVar25._8_4_ = 0.6933594;
      auVar25._12_4_ = 0.6933594;
      auVar25._0_4_ = 0.6933594;
      auVar25._4_4_ = 0.6933594;
      auVar25._16_4_ = 0.6933594;
      auVar25._20_4_ = 0.6933594;
      auVar25._24_4_ = 0.6933594;
      auVar25._28_4_ = 0.6933594;
      auVar8 = vfnmadd213ps_fma(auVar25,local_11c0,auVar5);
      local_948 = ::_ps256_cephes_exp_C2;
      local_3e0 = local_11c0._0_8_;
      uStack_3d8 = local_11c0._8_8_;
      uStack_3d0 = local_11c0._16_8_;
      uStack_3c8 = local_11c0._24_8_;
      local_400[0] = -0.00021219444;
      local_400[1] = -0.00021219444;
      afStack_3f8[0] = -0.00021219444;
      afStack_3f8[1] = -0.00021219444;
      afStack_3f0[0] = -0.00021219444;
      afStack_3f0[1] = -0.00021219444;
      afStack_3e8[0] = -0.00021219444;
      afStack_3e8[1] = -0.00021219444;
      local_1180._0_8_ = auVar8._0_8_;
      local_420 = local_1180._0_8_;
      local_1180._8_8_ = auVar8._8_8_;
      uStack_418 = local_1180._8_8_;
      uStack_410 = 0;
      uStack_408 = 0;
      auVar26._8_4_ = -0.00021219444;
      auVar26._12_4_ = -0.00021219444;
      auVar26._0_4_ = -0.00021219444;
      auVar26._4_4_ = -0.00021219444;
      auVar26._16_4_ = -0.00021219444;
      auVar26._20_4_ = -0.00021219444;
      auVar26._24_4_ = -0.00021219444;
      auVar26._28_4_ = -0.00021219444;
      auVar8 = vfnmadd213ps_fma(auVar26,local_11c0,ZEXT1632(auVar8));
      auVar44 = ZEXT1632(auVar8);
      local_1180._0_8_ = auVar8._0_8_;
      local_1000 = local_1180._0_8_;
      local_1180._8_8_ = auVar8._8_8_;
      uStack_ff8 = local_1180._8_8_;
      uStack_ff0 = 0;
      uStack_fe8 = 0;
      local_fe0._0_4_ = auVar8._0_4_;
      local_fe0._4_4_ = auVar8._4_4_;
      uStack_fd8._0_4_ = auVar8._8_4_;
      uStack_fd8._4_4_ = auVar8._12_4_;
      local_11a0._4_4_ = local_fe0._4_4_ * local_fe0._4_4_;
      local_11a0._0_4_ = (float)local_fe0 * (float)local_fe0;
      local_4c0 = local_11a0;
      uStack_1198._0_4_ = (float)uStack_fd8 * (float)uStack_fd8;
      uStack_1198._4_4_ = uStack_fd8._4_4_ * uStack_fd8._4_4_;
      auVar3 = _local_11a0;
      _local_11a0 = ZEXT1632(_local_11a0);
      auVar7 = _local_11a0;
      uStack_1238 = 0x3950696739506967;
      local_1240 = (undefined1  [8])0x3950696739506967;
      uStack_1230 = 0x3950696739506967;
      uStack_1228 = 0x3950696739506967;
      local_a38 = local_1240;
      local_9d0 = ::_ps256_cephes_exp_p1;
      local_680 = 0x3950696739506967;
      uStack_678 = 0x3950696739506967;
      uStack_670 = 0x3950696739506967;
      uStack_668 = 0x3950696739506967;
      local_6a0 = local_1180._0_8_;
      uStack_698 = local_1180._8_8_;
      uStack_690 = 0;
      uStack_688 = 0;
      local_6c0[0] = 0.0013981999;
      local_6c0[1] = 0.0013981999;
      afStack_6b8[0] = 0.0013981999;
      afStack_6b8[1] = 0.0013981999;
      afStack_6b0[0] = 0.0013981999;
      afStack_6b0[1] = 0.0013981999;
      afStack_6a8[0] = 0.0013981999;
      afStack_6a8[1] = 0.0013981999;
      auVar20._8_4_ = 0.0013981999;
      auVar20._12_4_ = 0.0013981999;
      auVar20._0_4_ = 0.0013981999;
      auVar20._4_4_ = 0.0013981999;
      auVar20._16_4_ = 0.0013981999;
      auVar20._20_4_ = 0.0013981999;
      auVar20._24_4_ = 0.0013981999;
      auVar20._28_4_ = 0.0013981999;
      auVar8 = vfmadd213ps_fma(auVar44,_local_1240,auVar20);
      local_9e8 = ::_ps256_cephes_exp_p2;
      local_1240 = auVar8._0_8_;
      local_620 = local_1240;
      uStack_1238 = auVar8._8_8_;
      uStack_618 = uStack_1238;
      uStack_610 = 0;
      uStack_608 = 0;
      local_640 = local_1180._0_8_;
      uStack_638 = local_1180._8_8_;
      uStack_630 = 0;
      uStack_628 = 0;
      local_660[0] = 0.008333452;
      local_660[1] = 0.008333452;
      afStack_658[0] = 0.008333452;
      afStack_658[1] = 0.008333452;
      afStack_650[0] = 0.008333452;
      afStack_650[1] = 0.008333452;
      afStack_648[0] = 0.008333452;
      afStack_648[1] = 0.008333452;
      auVar21._8_4_ = 0.008333452;
      auVar21._12_4_ = 0.008333452;
      auVar21._0_4_ = 0.008333452;
      auVar21._4_4_ = 0.008333452;
      auVar21._16_4_ = 0.008333452;
      auVar21._20_4_ = 0.008333452;
      auVar21._24_4_ = 0.008333452;
      auVar21._28_4_ = 0.008333452;
      auVar8 = vfmadd213ps_fma(auVar44,ZEXT1632(auVar8),auVar21);
      local_a00 = ::_ps256_cephes_exp_p3;
      local_1240 = auVar8._0_8_;
      local_5c0 = local_1240;
      uStack_1238 = auVar8._8_8_;
      uStack_5b8 = uStack_1238;
      uStack_5b0 = 0;
      uStack_5a8 = 0;
      local_5e0 = local_1180._0_8_;
      uStack_5d8 = local_1180._8_8_;
      uStack_5d0 = 0;
      uStack_5c8 = 0;
      local_600[0] = 0.041665796;
      local_600[1] = 0.041665796;
      afStack_5f8[0] = 0.041665796;
      afStack_5f8[1] = 0.041665796;
      afStack_5f0[0] = 0.041665796;
      afStack_5f0[1] = 0.041665796;
      afStack_5e8[0] = 0.041665796;
      afStack_5e8[1] = 0.041665796;
      auVar22._8_4_ = 0.041665796;
      auVar22._12_4_ = 0.041665796;
      auVar22._0_4_ = 0.041665796;
      auVar22._4_4_ = 0.041665796;
      auVar22._16_4_ = 0.041665796;
      auVar22._20_4_ = 0.041665796;
      auVar22._24_4_ = 0.041665796;
      auVar22._28_4_ = 0.041665796;
      auVar8 = vfmadd213ps_fma(auVar44,ZEXT1632(auVar8),auVar22);
      local_a18 = ::_ps256_cephes_exp_p4;
      local_1240 = auVar8._0_8_;
      local_560 = local_1240;
      uStack_1238 = auVar8._8_8_;
      uStack_558 = uStack_1238;
      uStack_550 = 0;
      uStack_548 = 0;
      local_580 = local_1180._0_8_;
      uStack_578 = local_1180._8_8_;
      uStack_570 = 0;
      uStack_568 = 0;
      local_5a0[0] = 0.16666666;
      local_5a0[1] = 0.16666666;
      afStack_598[0] = 0.16666666;
      afStack_598[1] = 0.16666666;
      afStack_590[0] = 0.16666666;
      afStack_590[1] = 0.16666666;
      afStack_588[0] = 0.16666666;
      afStack_588[1] = 0.16666666;
      auVar23._8_4_ = 0.16666666;
      auVar23._12_4_ = 0.16666666;
      auVar23._0_4_ = 0.16666666;
      auVar23._4_4_ = 0.16666666;
      auVar23._16_4_ = 0.16666666;
      auVar23._20_4_ = 0.16666666;
      auVar23._24_4_ = 0.16666666;
      auVar23._28_4_ = 0.16666666;
      auVar8 = vfmadd213ps_fma(auVar44,ZEXT1632(auVar8),auVar23);
      local_a30 = ::_ps256_cephes_exp_p5;
      local_1240 = auVar8._0_8_;
      local_500 = local_1240;
      uStack_1238 = auVar8._8_8_;
      uStack_4f8 = uStack_1238;
      uStack_4f0 = 0;
      uStack_4e8 = 0;
      local_520 = local_1180._0_8_;
      uStack_518 = local_1180._8_8_;
      uStack_510 = 0;
      uStack_508 = 0;
      local_540[0] = 0.5;
      local_540[1] = 0.5;
      afStack_538[0] = 0.5;
      afStack_538[1] = 0.5;
      afStack_530[0] = 0.5;
      afStack_530[1] = 0.5;
      afStack_528[0] = 0.5;
      afStack_528[1] = 0.5;
      auVar24._8_4_ = 0.5;
      auVar24._12_4_ = 0.5;
      auVar24._0_4_ = 0.5;
      auVar24._4_4_ = 0.5;
      auVar24._16_4_ = 0.5;
      auVar24._20_4_ = 0.5;
      auVar24._24_4_ = 0.5;
      auVar24._28_4_ = 0.5;
      auVar8 = vfmadd213ps_fma(auVar44,ZEXT1632(auVar8),auVar24);
      local_a40 = local_11a0;
      local_1240 = auVar8._0_8_;
      local_4a0 = local_1240;
      uStack_1238 = auVar8._8_8_;
      uStack_498 = uStack_1238;
      uStack_490 = 0;
      uStack_488 = 0;
      uStack_1198 = auVar3._8_8_;
      uStack_4b8 = uStack_1198;
      uStack_4b0 = 0;
      uStack_4a8 = 0;
      local_4e0 = local_1180._0_8_;
      uStack_4d8 = local_1180._8_8_;
      uStack_4d0 = 0;
      uStack_4c8 = 0;
      auVar8 = vfmadd213ps_fma(auVar7,ZEXT1632(auVar8),auVar44);
      local_1240 = auVar8._0_8_;
      uVar9 = local_1240;
      uStack_1238 = auVar8._8_8_;
      uVar10 = uStack_1238;
      uStack_f10 = 0;
      uStack_f08 = 0;
      local_f40 = 0x3f8000003f800000;
      uStack_f38 = 0x3f8000003f800000;
      uStack_f30 = 0x3f8000003f800000;
      uStack_f28 = 0x3f8000003f800000;
      local_f20._0_4_ = auVar8._0_4_;
      local_f20._4_4_ = auVar8._4_4_;
      uStack_f18._0_4_ = auVar8._8_4_;
      uStack_f18._4_4_ = auVar8._12_4_;
      local_1240._4_4_ = local_f20._4_4_ + 1.0;
      local_1240._0_4_ = (float)local_f20 + 1.0;
      uStack_1238._0_4_ = (float)uStack_f18 + 1.0;
      uStack_1238._4_4_ = uStack_f18._4_4_ + 1.0;
      uStack_1230._0_4_ = 0x3f800000;
      uStack_1230._4_4_ = 0x3f800000;
      auVar41 = _local_1240;
      uStack_1228._0_4_ = 0x3f800000;
      uStack_1228._4_4_ = 0x3f800000;
      auVar6 = _local_1240;
      local_920._0_4_ = local_11c0._0_4_;
      local_920._4_4_ = local_11c0._4_4_;
      uStack_918._0_4_ = local_11c0._8_4_;
      uStack_918._4_4_ = local_11c0._12_4_;
      uStack_910._0_4_ = local_11c0._16_4_;
      uStack_910._4_4_ = local_11c0._20_4_;
      uStack_908._0_4_ = local_11c0._24_4_;
      uStack_908._4_4_ = local_11c0._28_4_;
      local_11e0 = CONCAT44((int)local_920._4_4_,(int)(float)local_920);
      uStack_11d8 = CONCAT44((int)uStack_918._4_4_,(int)(float)uStack_918);
      uStack_11d0 = CONCAT44((int)uStack_910._4_4_,(int)(float)uStack_910);
      uStack_11c8 = CONCAT44((int)uStack_908._4_4_,(int)(float)uStack_908);
      local_820 = local_11e0;
      uStack_818 = uStack_11d8;
      uStack_810 = uStack_11d0;
      uStack_808 = uStack_11c8;
      local_840 = 0x7f0000007f;
      uStack_838 = 0x7f0000007f;
      uStack_830 = 0x7f0000007f;
      uStack_828 = 0x7f0000007f;
      local_8c0 = local_11e0;
      uStack_8b8 = uStack_11d8;
      uStack_8b0 = uStack_11d0;
      uStack_8a8 = uStack_11c8;
      local_8e0 = 0x7f0000007f;
      uStack_8d8 = 0x7f0000007f;
      uStack_8d0 = 0x7f0000007f;
      uStack_8c8 = 0x7f0000007f;
      local_870 = 0x7f0000007f;
      uStack_868 = 0x7f0000007f;
      local_880 = 0x7f0000007f;
      uStack_878 = 0x7f0000007f;
      local_380 = local_11e0;
      uStack_378 = uStack_11d8;
      local_390 = 0x7f0000007f;
      uStack_388 = 0x7f0000007f;
      auVar28._8_8_ = uStack_11d8;
      auVar28._0_8_ = local_11e0;
      auVar27._8_8_ = 0x7f0000007f;
      auVar27._0_8_ = 0x7f0000007f;
      local_850 = vpaddd_avx(auVar28,auVar27);
      local_3a0 = uStack_11d0;
      uStack_398 = uStack_11c8;
      local_3b0 = 0x7f0000007f;
      uStack_3a8 = 0x7f0000007f;
      auVar3._8_8_ = uStack_11c8;
      auVar3._0_8_ = uStack_11d0;
      auVar8._8_8_ = 0x7f0000007f;
      auVar8._0_8_ = 0x7f0000007f;
      local_860 = vpaddd_avx(auVar3,auVar8);
      local_900 = local_850._0_8_;
      uStack_8f8 = local_850._8_8_;
      uStack_8f0 = local_860._0_8_;
      uStack_8e8 = local_860._8_8_;
      local_8a0 = local_850._0_8_;
      uStack_898 = local_850._8_8_;
      uStack_890 = local_860._0_8_;
      uStack_888 = local_860._8_8_;
      local_760 = local_850._0_8_;
      uStack_758 = local_850._8_8_;
      uStack_750 = local_860._0_8_;
      uStack_748 = local_860._8_8_;
      local_764 = 0x17;
      local_7e0 = local_850._0_8_;
      uStack_7d8 = local_850._8_8_;
      uStack_7d0 = local_860._0_8_;
      uStack_7c8 = local_860._8_8_;
      local_320 = local_850._0_8_;
      uStack_318 = local_850._8_8_;
      local_324 = 0x17;
      local_780 = vpslld_avx(local_850,ZEXT416(0x17));
      local_340 = local_860._0_8_;
      uStack_338 = local_860._8_8_;
      local_344 = 0x17;
      local_790 = vpslld_avx(local_860,ZEXT416(0x17));
      local_800 = local_780._0_8_;
      uStack_7f8 = local_780._8_8_;
      uStack_7f0 = local_790._0_8_;
      uStack_7e8 = local_790._8_8_;
      local_7c0 = local_780._0_8_;
      uStack_7b8 = local_780._8_8_;
      uStack_7b0 = local_790._0_8_;
      uStack_7a8 = local_790._8_8_;
      local_11e0 = local_780._0_8_;
      uStack_11d8 = local_780._8_8_;
      uStack_11d0 = local_790._0_8_;
      uStack_11c8 = local_790._8_8_;
      local_740 = local_780._0_8_;
      uStack_738 = local_780._8_8_;
      uStack_730 = local_790._0_8_;
      uStack_728 = local_790._8_8_;
      local_1260 = local_780._0_8_;
      uStack_1258 = local_780._8_8_;
      uStack_1250 = local_790._0_8_;
      uStack_1248 = local_790._8_8_;
      local_1020 = local_1240;
      uStack_1018 = uStack_1238;
      uStack_1230 = auVar41._16_8_;
      uStack_1010 = uStack_1230;
      uStack_1228 = auVar6._24_8_;
      uStack_1008 = uStack_1228;
      local_1040._0_4_ = local_780._0_4_;
      local_1040._4_4_ = local_780._4_4_;
      uStack_1038._0_4_ = local_780._8_4_;
      uStack_1038._4_4_ = local_780._12_4_;
      uStack_1030._0_4_ = local_790._0_4_;
      uStack_1030._4_4_ = local_790._4_4_;
      uStack_1028._0_4_ = local_790._8_4_;
      local_1240._4_4_ = (local_f20._4_4_ + 1.0) * local_1040._4_4_;
      local_1240._0_4_ = ((float)local_f20 + 1.0) * (float)local_1040;
      uStack_1238._0_4_ = ((float)uStack_f18 + 1.0) * (float)uStack_1038;
      uStack_1238._4_4_ = (uStack_f18._4_4_ + 1.0) * uStack_1038._4_4_;
      uStack_1230._0_4_ = (float)uStack_1030 * 1.0;
      uStack_1230._4_4_ = uStack_1030._4_4_ * 1.0;
      auVar41 = _local_1240;
      uStack_1228._0_4_ = (float)uStack_1028 * 1.0;
      uStack_1228._4_4_ = 0x3f800000;
      auVar5 = _local_1240;
      uStack_1230 = auVar41._16_8_;
      uStack_1228 = auVar5._24_8_;
      local_1060 = local_1240;
      uStack_1058 = uStack_1238;
      uStack_1050 = uStack_1230;
      uStack_1048 = uStack_1228;
      local_1080 = local_b20._0_8_;
      uStack_1078 = local_b20._8_8_;
      uStack_1070 = auStack_b10._0_8_;
      uStack_1068 = auStack_b10._8_8_;
      auVar15._16_8_ = uStack_1230;
      auVar15._0_16_ = _local_1240;
      auVar15._24_8_ = uStack_1228;
      auVar6._16_8_ = auStack_b10._0_8_;
      auVar6._0_16_ = local_b20;
      auVar6._24_8_ = auStack_b10._8_8_;
      auVar6 = vsubps_avx(auVar15,auVar6);
      local_1500 = auVar6._0_8_;
      uVar11 = local_1500;
      uStack_14f8 = auVar6._8_8_;
      uVar12 = uStack_14f8;
      uStack_14f0 = auVar6._16_8_;
      uVar13 = uStack_14f0;
      uStack_14e8 = auVar6._24_8_;
      uVar14 = uStack_14e8;
      local_f60._0_4_ = local_ae0._0_4_;
      local_f60._4_4_ = local_ae0._4_4_;
      uStack_f58._0_4_ = local_ae0._8_4_;
      uStack_f58._4_4_ = local_ae0._12_4_;
      uStack_f50._0_4_ = auStack_ad0._0_4_;
      uStack_f50._4_4_ = auStack_ad0._4_4_;
      uStack_f48._0_4_ = auStack_ad0._8_4_;
      uStack_f48._4_4_ = auStack_ad0._12_4_;
      local_f80._0_4_ = auVar6._0_4_;
      local_f80._4_4_ = auVar6._4_4_;
      uStack_f78._0_4_ = auVar6._8_4_;
      uStack_f78._4_4_ = auVar6._12_4_;
      uStack_f70._0_4_ = auVar6._16_4_;
      uStack_f70._4_4_ = auVar6._20_4_;
      uStack_f68._0_4_ = auVar6._24_4_;
      local_1500 = CONCAT44(local_f60._4_4_ * local_f80._4_4_,(float)local_f60 * (float)local_f80);
      uStack_14f8._0_4_ = (float)uStack_f58 * (float)uStack_f78;
      uStack_14f8._4_4_ = uStack_f58._4_4_ * uStack_f78._4_4_;
      uStack_14f0._0_4_ = (float)uStack_f50 * (float)uStack_f70;
      uStack_14f0._4_4_ = uStack_f50._4_4_ * uStack_f70._4_4_;
      auVar41 = _local_1500;
      uStack_14e8._0_4_ = (float)uStack_f48 * (float)uStack_f68;
      uStack_14e8._4_4_ = uStack_f48._4_4_;
      auVar6 = _local_1500;
      local_14c0 = auVar4._0_8_;
      uStack_14b8 = auVar4._8_8_;
      uStack_14b0 = auVar4._16_8_;
      uStack_14a8 = auVar4._24_8_;
      local_f00 = local_1500;
      uStack_ef8 = uStack_14f8;
      uStack_14f0 = auVar41._16_8_;
      uStack_ef0 = uStack_14f0;
      uStack_14e8 = auVar6._24_8_;
      uStack_ee8 = uStack_14e8;
      local_ee0._0_4_ = auVar4._0_4_;
      local_ee0._4_4_ = auVar4._4_4_;
      uStack_ed8._0_4_ = auVar4._8_4_;
      uStack_ed8._4_4_ = auVar4._12_4_;
      uStack_ed0._0_4_ = auVar4._16_4_;
      uStack_ed0._4_4_ = auVar4._20_4_;
      uStack_ec8._0_4_ = auVar4._24_4_;
      uStack_ec8._4_4_ = auVar4._28_4_;
      local_fc0 = (float)local_ee0 + (float)local_f60 * (float)local_f80;
      fStack_fbc = local_ee0._4_4_ + local_f60._4_4_ * local_f80._4_4_;
      fStack_fb8 = (float)uStack_ed8 + (float)uStack_f58 * (float)uStack_f78;
      fStack_fb4 = uStack_ed8._4_4_ + uStack_f58._4_4_ * uStack_f78._4_4_;
      fStack_fb0 = (float)uStack_ed0 + (float)uStack_f50 * (float)uStack_f70;
      fStack_fac = uStack_ed0._4_4_ + uStack_f50._4_4_ * uStack_f70._4_4_;
      fStack_fa8 = (float)uStack_ec8 + (float)uStack_f48 * (float)uStack_f68;
      fStack_fa4 = uStack_ec8._4_4_ + uStack_f48._4_4_;
      local_fa0._0_4_ = auVar2._0_4_;
      local_fa0._4_4_ = auVar2._4_4_;
      uStack_f98._0_4_ = auVar2._8_4_;
      uStack_f98._4_4_ = auVar2._12_4_;
      uStack_f90._0_4_ = auVar1._0_4_;
      uStack_f90._4_4_ = auVar1._4_4_;
      uStack_f88._0_4_ = auVar1._8_4_;
      uStack_f88._4_4_ = auVar1._12_4_;
      local_1500 = CONCAT44(local_fa0._4_4_ * fStack_fbc,(float)local_fa0 * local_fc0);
      uStack_14f8._0_4_ = (float)uStack_f98 * fStack_fb8;
      uStack_14f8._4_4_ = uStack_f98._4_4_ * fStack_fb4;
      uStack_14f0._0_4_ = (float)uStack_f90 * fStack_fb0;
      uStack_14f0._4_4_ = uStack_f90._4_4_ * fStack_fac;
      auVar41 = _local_1500;
      uStack_14e8._0_4_ = (float)uStack_f88 * fStack_fa8;
      uStack_14e8._4_4_ = uStack_f88._4_4_;
      auVar6 = _local_1500;
      local_e98 = local_1398;
      local_ec0 = local_1500;
      uStack_eb8 = uStack_14f8;
      uStack_14f0 = auVar41._16_8_;
      uStack_eb0 = uStack_14f0;
      uStack_14e8 = auVar6._24_8_;
      uStack_ea8 = uStack_14e8;
      *(undefined8 *)*local_1398 = local_1500;
      *(undefined8 *)(*local_1398 + 8) = uStack_14f8;
      *(undefined8 *)(*local_1398 + 0x10) = uStack_14f0;
      *(undefined8 *)(*local_1398 + 0x18) = uStack_14e8;
      local_1398 = local_1398 + 1;
      local_12a0 = local_12e0;
      uStack_1298 = uStack_12d8;
      uStack_1290 = uStack_12d0;
      uStack_1288 = uStack_12c8;
      _local_1240 = auVar5;
      _local_11a0 = auVar7;
      local_1180 = auVar44;
      local_1040 = local_780._0_8_;
      uStack_1038 = local_780._8_8_;
      uStack_1030 = local_790._0_8_;
      uStack_1028 = local_790._8_8_;
      local_fe0 = local_1000;
      uStack_fd8 = uStack_ff8;
      uStack_fd0 = uStack_ff0;
      uStack_fc8 = uStack_fe8;
      local_fa0 = local_aa0._0_8_;
      uStack_f98 = local_aa0._8_8_;
      uStack_f90 = local_aa0._16_8_;
      uStack_f88 = local_aa0._24_8_;
      local_f80 = uVar11;
      uStack_f78 = uVar12;
      uStack_f70 = uVar13;
      uStack_f68 = uVar14;
      local_f60 = local_ae0._0_8_;
      uStack_f58 = local_ae0._8_8_;
      uStack_f50 = auStack_ad0._0_8_;
      uStack_f48 = auStack_ad0._8_8_;
      local_f20 = uVar9;
      uStack_f18 = uVar10;
      local_ee0 = local_14c0;
      uStack_ed8 = uStack_14b8;
      uStack_ed0 = uStack_14b0;
      uStack_ec8 = uStack_14a8;
      local_a28 = local_a48;
      local_a20 = local_a38;
      local_a10 = local_a48;
      local_a08 = local_a38;
      local_9f8 = local_a48;
      local_9f0 = local_a38;
      local_9e0 = local_a48;
      local_9d8 = local_a38;
      local_9c8 = local_a48;
      local_9c0 = local_a38;
      local_9a8 = local_a48;
      local_950 = local_a48;
      local_938 = local_a48;
      local_928 = local_940;
      local_920 = local_11c0._0_8_;
      uStack_918 = local_11c0._8_8_;
      uStack_910 = local_11c0._16_8_;
      uStack_908 = local_11c0._24_8_;
    }
    local_e90 = 0;
    uStack_e88 = 0;
    local_e2c = 0x3f800000;
    local_e40 = 0x3f800000;
    uStack_e3c = 0x3f800000;
    uStack_e38 = 0x3f800000;
    uStack_e34 = 0x3f800000;
    local_e60 = *(float *)(in_RDI + 0xd0);
    local_e80 = *(float *)(in_RDI + 0xd4);
    for (; local_13f0 + 3 < local_1388; local_13f0 = local_13f0 + 4) {
      local_e28 = local_1398;
      local_e20 = *(undefined8 *)*local_1398;
      uStack_e18 = *(undefined8 *)(*local_1398 + 8);
      local_e10 = 0;
      uStack_e08 = 0;
      auVar8 = vmaxps_avx(ZEXT816(0),*(undefined1 (*) [16])*local_1398);
      local_df0 = 0;
      uStack_de8 = 0;
      auVar1 = vminps_avx(ZEXT816(0),*(undefined1 (*) [16])*local_1398);
      local_1570 = auVar1._0_8_;
      uStack_1568 = auVar1._8_8_;
      local_d60 = ZEXT816(0) << 0x20;
      local_db0 = 0x3f8000003f800000;
      uStack_da8 = 0x3f8000003f800000;
      local_d20 = local_1570;
      uStack_d18 = uStack_1568;
      local_d30 = 0x42b0c0a542b0c0a5;
      uStack_d28 = 0x42b0c0a542b0c0a5;
      auVar16._8_8_ = 0x42b0c0a542b0c0a5;
      auVar16._0_8_ = 0x42b0c0a542b0c0a5;
      auVar1 = vminps_avx(auVar1,auVar16);
      local_d70._0_8_ = auVar1._0_8_;
      local_d40 = local_d70._0_8_;
      local_d70._8_8_ = auVar1._8_8_;
      uStack_d38 = local_d70._8_8_;
      local_d50 = 0xc2b0c0a5c2b0c0a5;
      uStack_d48 = 0xc2b0c0a5c2b0c0a5;
      auVar2._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar2._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar3 = vmaxps_avx(auVar1,auVar2);
      local_d70._0_8_ = auVar3._0_8_;
      uVar9 = local_d70._0_8_;
      local_d70._8_8_ = auVar3._8_8_;
      uVar10 = local_d70._8_8_;
      local_c90 = 0x3fb8aa3b3fb8aa3b;
      uStack_c88 = 0x3fb8aa3b3fb8aa3b;
      local_c80._0_4_ = auVar3._0_4_;
      local_c80._4_4_ = auVar3._4_4_;
      uStack_c78._0_4_ = auVar3._8_4_;
      uStack_c78._4_4_ = auVar3._12_4_;
      local_d90._4_4_ = local_c80._4_4_ * 1.442695;
      local_d90._0_4_ = (float)local_c80 * 1.442695;
      uStack_d88._0_4_ = (float)uStack_c78 * 1.442695;
      uStack_d88._4_4_ = uStack_c78._4_4_ * 1.442695;
      local_c00 = local_d90;
      uStack_bf8 = uStack_d88;
      local_c10 = 0x3f0000003f000000;
      uStack_c08 = 0x3f0000003f000000;
      local_d90._0_4_ = (float)local_c80 * 1.442695 + 0.5;
      local_d90._4_4_ = local_c80._4_4_ * 1.442695 + 0.5;
      fVar45 = (float)uStack_c78 * 1.442695 + 0.5;
      fVar46 = uStack_c78._4_4_ * 1.442695 + 0.5;
      uStack_d88._0_4_ = fVar45;
      uStack_d88._4_4_ = fVar46;
      local_2e0 = local_d90;
      uStack_2d8 = uStack_d88;
      local_da0._4_4_ = (int)(float)local_d90._4_4_;
      local_da0._0_4_ = (int)(float)local_d90._0_4_;
      local_da0._8_4_ = (int)fVar45;
      local_da0._12_4_ = (int)fVar46;
      local_2d0 = local_da0._0_8_;
      uStack_2c8 = local_da0._8_8_;
      auVar31._8_8_ = local_da0._8_8_;
      auVar31._0_8_ = local_da0._0_8_;
      auVar2 = vcvtdq2ps_avx(auVar31);
      local_d80 = auVar2._0_8_;
      local_2b0 = local_d80;
      uStack_d78 = auVar2._8_8_;
      uStack_2a8 = uStack_d78;
      local_2c0 = local_d90;
      uStack_2b8 = uStack_d88;
      auVar32._8_8_ = uStack_d88;
      auVar32._0_8_ = local_d90;
      auVar1 = vcmpps_avx(auVar32,auVar2,1);
      local_dc0._0_8_ = auVar1._0_8_;
      local_290 = local_dc0._0_8_;
      local_dc0._8_8_ = auVar1._8_8_;
      uStack_288 = local_dc0._8_8_;
      local_2a0 = 0x3f8000003f800000;
      uStack_298 = 0x3f8000003f800000;
      auVar33._8_8_ = 0x3f8000003f800000;
      auVar33._0_8_ = 0x3f8000003f800000;
      local_dc0 = vpand_avx(auVar1,auVar33);
      local_d00 = local_d80;
      uStack_cf8 = uStack_d78;
      local_d10 = local_dc0._0_8_;
      uStack_d08 = local_dc0._8_8_;
      _local_d90 = vsubps_avx(auVar2,local_dc0);
      local_270 = local_d90;
      local_260 = ::_ps_cephes_exp_C1;
      local_280 = local_d70;
      local_190 = local_d90;
      uStack_188 = uStack_d88;
      local_1a0[0] = 0.6933594;
      local_1a0[1] = 0.6933594;
      afStack_198[0] = 0.6933594;
      afStack_198[1] = 0.6933594;
      local_1b0 = local_d70._0_8_;
      uStack_1a8 = local_d70._8_8_;
      auVar34._8_4_ = 0.6933594;
      auVar34._12_4_ = 0.6933594;
      auVar34._0_4_ = 0.6933594;
      auVar34._4_4_ = 0.6933594;
      auVar1 = vfnmadd213ps_fma(auVar34,_local_d90,auVar3);
      local_278 = ::_ps_cephes_exp_C2;
      local_160 = local_d90;
      uStack_158 = uStack_d88;
      local_170[0] = -0.00021219444;
      local_170[1] = -0.00021219444;
      afStack_168[0] = -0.00021219444;
      afStack_168[1] = -0.00021219444;
      local_d70._0_8_ = auVar1._0_8_;
      local_180 = local_d70._0_8_;
      local_d70._8_8_ = auVar1._8_8_;
      uStack_178 = local_d70._8_8_;
      auVar35._8_4_ = -0.00021219444;
      auVar35._12_4_ = -0.00021219444;
      auVar35._0_4_ = -0.00021219444;
      auVar35._4_4_ = -0.00021219444;
      local_d70 = vfnmadd213ps_fma(auVar35,_local_d90,auVar1);
      local_cb0 = local_d70._0_8_;
      uStack_ca8 = local_d70._8_8_;
      local_ca0._0_4_ = local_d70._0_4_;
      local_ca0._4_4_ = local_d70._4_4_;
      uStack_c98._0_4_ = local_d70._8_4_;
      uStack_c98._4_4_ = local_d70._12_4_;
      local_d80._4_4_ = local_ca0._4_4_ * local_ca0._4_4_;
      local_d80._0_4_ = (float)local_ca0 * (float)local_ca0;
      uStack_d78._0_4_ = (float)uStack_c98 * (float)uStack_c98;
      uStack_d78._4_4_ = uStack_c98._4_4_ * uStack_c98._4_4_;
      uStack_dc8 = 0x3950696739506967;
      local_dd0 = (undefined1  [8])0x3950696739506967;
      local_240 = local_dd0;
      local_1d8 = ::_ps_cephes_exp_p1;
      local_130 = 0x3950696739506967;
      uStack_128 = 0x3950696739506967;
      local_140 = local_d70._0_8_;
      uStack_138 = local_d70._8_8_;
      local_150[0] = 0.0013981999;
      local_150[1] = 0.0013981999;
      afStack_148[0] = 0.0013981999;
      afStack_148[1] = 0.0013981999;
      auVar36._8_4_ = 0.0013981999;
      auVar36._12_4_ = 0.0013981999;
      auVar36._0_4_ = 0.0013981999;
      auVar36._4_4_ = 0.0013981999;
      auVar1 = vfmadd213ps_fma(local_d70,_local_dd0,auVar36);
      local_1f0 = ::_ps_cephes_exp_p2;
      local_dd0 = auVar1._0_8_;
      local_100 = local_dd0;
      uStack_dc8 = auVar1._8_8_;
      uStack_f8 = uStack_dc8;
      local_110 = local_d70._0_8_;
      uStack_108 = local_d70._8_8_;
      local_120[0] = 0.008333452;
      local_120[1] = 0.008333452;
      afStack_118[0] = 0.008333452;
      afStack_118[1] = 0.008333452;
      auVar37._8_4_ = 0.008333452;
      auVar37._12_4_ = 0.008333452;
      auVar37._0_4_ = 0.008333452;
      auVar37._4_4_ = 0.008333452;
      auVar1 = vfmadd213ps_fma(local_d70,auVar1,auVar37);
      local_208 = ::_ps_cephes_exp_p3;
      local_dd0 = auVar1._0_8_;
      local_d0 = local_dd0;
      uStack_dc8 = auVar1._8_8_;
      uStack_c8 = uStack_dc8;
      local_e0 = local_d70._0_8_;
      uStack_d8 = local_d70._8_8_;
      local_f0[0] = 0.041665796;
      local_f0[1] = 0.041665796;
      afStack_e8[0] = 0.041665796;
      afStack_e8[1] = 0.041665796;
      auVar38._8_4_ = 0.041665796;
      auVar38._12_4_ = 0.041665796;
      auVar38._0_4_ = 0.041665796;
      auVar38._4_4_ = 0.041665796;
      auVar1 = vfmadd213ps_fma(local_d70,auVar1,auVar38);
      local_220 = ::_ps_cephes_exp_p4;
      local_dd0 = auVar1._0_8_;
      local_a0 = local_dd0;
      uStack_dc8 = auVar1._8_8_;
      uStack_98 = uStack_dc8;
      local_b0 = local_d70._0_8_;
      uStack_a8 = local_d70._8_8_;
      local_c0[0] = 0.16666666;
      local_c0[1] = 0.16666666;
      afStack_b8[0] = 0.16666666;
      afStack_b8[1] = 0.16666666;
      auVar39._8_4_ = 0.16666666;
      auVar39._12_4_ = 0.16666666;
      auVar39._0_4_ = 0.16666666;
      auVar39._4_4_ = 0.16666666;
      auVar1 = vfmadd213ps_fma(local_d70,auVar1,auVar39);
      local_238 = ::_ps_cephes_exp_p5;
      local_dd0 = auVar1._0_8_;
      local_70 = local_dd0;
      uStack_dc8 = auVar1._8_8_;
      uStack_68 = uStack_dc8;
      local_80 = local_d70._0_8_;
      uStack_78 = local_d70._8_8_;
      local_90[0] = 0.5;
      local_90[1] = 0.5;
      afStack_88[0] = 0.5;
      afStack_88[1] = 0.5;
      auVar40._8_4_ = 0.5;
      auVar40._12_4_ = 0.5;
      auVar40._0_4_ = 0.5;
      auVar40._4_4_ = 0.5;
      auVar1 = vfmadd213ps_fma(local_d70,auVar1,auVar40);
      local_248 = local_d80;
      local_dd0 = auVar1._0_8_;
      local_40 = local_dd0;
      uStack_dc8 = auVar1._8_8_;
      uStack_38 = uStack_dc8;
      local_50 = local_d80;
      uStack_48 = uStack_d78;
      local_60 = local_d70._0_8_;
      uStack_58 = local_d70._8_8_;
      auVar1 = vfmadd213ps_fma(_local_d80,auVar1,local_d70);
      local_dd0 = auVar1._0_8_;
      uVar11 = local_dd0;
      uStack_dc8 = auVar1._8_8_;
      uVar12 = uStack_dc8;
      local_c30 = 0x3f8000003f800000;
      uStack_c28 = 0x3f8000003f800000;
      local_c20._0_4_ = auVar1._0_4_;
      local_c20._4_4_ = auVar1._4_4_;
      uStack_c18._0_4_ = auVar1._8_4_;
      uStack_c18._4_4_ = auVar1._12_4_;
      local_dd0._4_4_ = local_c20._4_4_ + 1.0;
      local_dd0._0_4_ = (float)local_c20 + 1.0;
      uStack_dc8._0_4_ = (float)uStack_c18 + 1.0;
      uStack_dc8._4_4_ = uStack_c18._4_4_ + 1.0;
      local_2f0._0_4_ = local_d90._0_4_;
      local_2f0._4_4_ = local_d90._4_4_;
      uStack_2e8._0_4_ = local_d90._8_4_;
      uStack_2e8._4_4_ = local_d90._12_4_;
      local_da0._4_4_ = (int)local_2f0._4_4_;
      local_da0._0_4_ = (int)(float)local_2f0;
      local_da0._8_4_ = (int)(float)uStack_2e8;
      local_da0._12_4_ = (int)uStack_2e8._4_4_;
      local_360 = local_da0._0_8_;
      uStack_358 = local_da0._8_8_;
      local_370 = 0x7f0000007f;
      uStack_368 = 0x7f0000007f;
      auVar30._8_8_ = local_da0._8_8_;
      auVar30._0_8_ = local_da0._0_8_;
      auVar29._8_8_ = 0x7f0000007f;
      auVar29._0_8_ = 0x7f0000007f;
      auVar1 = vpaddd_avx(auVar30,auVar29);
      local_da0._0_8_ = auVar1._0_8_;
      local_300 = local_da0._0_8_;
      local_da0._8_8_ = auVar1._8_8_;
      uStack_2f8 = local_da0._8_8_;
      local_304 = 0x17;
      local_da0 = vpslld_avx(auVar1,ZEXT416(0x17));
      local_1c0 = local_da0._0_8_;
      uStack_1b8 = local_da0._8_8_;
      local_de0 = local_da0._0_8_;
      uStack_dd8 = local_da0._8_8_;
      local_cc0 = local_dd0;
      uStack_cb8 = uStack_dc8;
      local_cd0._0_4_ = local_da0._0_4_;
      local_cd0._4_4_ = local_da0._4_4_;
      uStack_cc8._0_4_ = local_da0._8_4_;
      uStack_cc8._4_4_ = local_da0._12_4_;
      local_dd0._4_4_ = (local_c20._4_4_ + 1.0) * local_cd0._4_4_;
      local_dd0._0_4_ = ((float)local_c20 + 1.0) * (float)local_cd0;
      uStack_dc8._0_4_ = ((float)uStack_c18 + 1.0) * (float)uStack_cc8;
      uStack_dc8._4_4_ = (uStack_c18._4_4_ + 1.0) * uStack_cc8._4_4_;
      local_ce0 = local_dd0;
      uStack_cd8 = uStack_dc8;
      auVar17._8_8_ = uStack_dc8;
      auVar17._0_8_ = local_dd0;
      auVar1._8_8_ = 0x3f8000003f800000;
      auVar1._0_8_ = 0x3f8000003f800000;
      auVar1 = vsubps_avx(auVar17,auVar1);
      local_1580 = auVar1._0_8_;
      uVar13 = local_1580;
      uStack_1578 = auVar1._8_8_;
      uVar14 = uStack_1578;
      local_c50._0_4_ = auVar1._0_4_;
      local_c50._4_4_ = auVar1._4_4_;
      uStack_c48._0_4_ = auVar1._8_4_;
      uStack_c48._4_4_ = auVar1._12_4_;
      local_1580 = CONCAT44(local_e60 * local_c50._4_4_,local_e60 * (float)local_c50);
      uStack_1578._0_4_ = local_e60 * (float)uStack_c48;
      uStack_1578._4_4_ = local_e60 * uStack_c48._4_4_;
      local_1560 = auVar8._0_8_;
      uStack_1558 = auVar8._8_8_;
      local_bf0 = local_1580;
      uStack_be8 = uStack_1578;
      local_be0._0_4_ = auVar8._0_4_;
      local_be0._4_4_ = auVar8._4_4_;
      uStack_bd8._0_4_ = auVar8._8_4_;
      uStack_bd8._4_4_ = auVar8._12_4_;
      local_c70 = (float)local_be0 + local_e60 * (float)local_c50;
      fStack_c6c = local_be0._4_4_ + local_e60 * local_c50._4_4_;
      fStack_c68 = (float)uStack_bd8 + local_e60 * (float)uStack_c48;
      fStack_c64 = uStack_bd8._4_4_ + local_e60 * uStack_c48._4_4_;
      local_1580 = CONCAT44(local_e80 * fStack_c6c,local_e80 * local_c70);
      uStack_1578._0_4_ = local_e80 * fStack_c68;
      uStack_1578._4_4_ = local_e80 * fStack_c64;
      local_bb8 = local_1398;
      local_bd0 = local_1580;
      uStack_bc8 = uStack_1578;
      *(undefined8 *)*local_1398 = local_1580;
      *(undefined8 *)(*local_1398 + 8) = uStack_1578;
      local_1398 = (undefined1 (*) [32])(*local_1398 + 0x10);
      local_e00 = local_e20;
      uStack_df8 = uStack_e18;
      local_cf0 = 0x3f8000003f800000;
      uStack_ce8 = 0x3f8000003f800000;
      local_cd0 = local_da0._0_8_;
      uStack_cc8 = local_da0._8_8_;
      local_ca0 = local_cb0;
      uStack_c98 = uStack_ca8;
      local_c80 = uVar9;
      uStack_c78 = uVar10;
      local_c60 = CONCAT44(local_e80,local_e80);
      uStack_c58 = CONCAT44(local_e80,local_e80);
      local_c50 = uVar13;
      uStack_c48 = uVar14;
      local_c40 = CONCAT44(local_e60,local_e60);
      uStack_c38 = CONCAT44(local_e60,local_e60);
      local_c20 = uVar11;
      uStack_c18 = uVar12;
      local_be0 = local_1560;
      uStack_bd8 = uStack_1558;
      local_2f0 = local_d90;
      uStack_2e8 = uStack_d88;
      local_268 = local_280;
      local_258 = local_270;
      local_250 = local_280;
      local_230 = local_280;
      local_228 = local_240;
      local_218 = local_280;
      local_210 = local_240;
      local_200 = local_280;
      local_1f8 = local_240;
      local_1e8 = local_280;
      local_1e0 = local_240;
      local_1d0 = local_280;
      local_1c8 = local_240;
    }
    fVar45 = *(float *)(in_RDI + 0xd0);
    fVar46 = *(float *)(in_RDI + 0xd4);
    fStack_e7c = local_e80;
    fStack_e78 = local_e80;
    fStack_e74 = local_e80;
    local_e64 = local_e80;
    fStack_e5c = local_e60;
    fStack_e58 = local_e60;
    fStack_e54 = local_e60;
    local_e44 = local_e60;
    local_b50 = local_1330;
    local_ac0 = local_12f0;
    local_abc = local_12f0;
    local_ab8 = local_12f0;
    local_ab4 = local_12f0;
    local_ab0 = local_12f0;
    local_aac = local_12f0;
    local_aa8 = local_12f0;
    local_aa4 = local_12f0;
    local_aa0 = auVar43;
    local_a68 = local_12f4;
    local_a64 = local_12f4;
    local_a60 = local_12f4;
    local_a5c = local_12f4;
    local_a58 = local_12f4;
    local_a54 = local_12f4;
    local_a50 = local_12f4;
    local_a4c = local_12f4;
    local_13c0 = local_bb0;
    for (; local_13f0 < local_1388; local_13f0 = local_13f0 + 1) {
      if (0.0 <= *(float *)*local_1398) {
        *(float *)*local_1398 = *(float *)*local_1398 * *(float *)(in_RDI + 0xd4);
      }
      else {
        fVar42 = expf(*(float *)*local_1398);
        *(float *)*local_1398 = (fVar42 - 1.0) * fVar45 * fVar46;
      }
      local_1398 = (undefined1 (*) [32])(*local_1398 + 4);
    }
  }
  return 0;
}

Assistant:

int SELU_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int elempack = bottom_top_blob.elempack;
    int channels = bottom_top_blob.c;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _zero512 = _mm512_setzero_ps();
        __m512 _one512 = _mm512_set1_ps(1.f);
        __m512 _alpha512 = _mm512_set1_ps(alpha);
        __m512 _lambda512 = _mm512_set1_ps(lambda);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);

            __m512 _pos = _mm512_max_ps(_zero512, _p);
            __m512 _neg = _mm512_min_ps(_zero512, _p);

            __m512 _blob = exp512_ps(_neg);
            _blob = _mm512_sub_ps(_blob, _one512);
            _blob = _mm512_mul_ps(_alpha512, _blob);
            _blob = _mm512_mul_ps(_lambda512, _mm512_add_ps(_pos, _blob));

            _mm512_storeu_ps(ptr, _blob);

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _zero256 = _mm256_setzero_ps();
        __m256 _one256 = _mm256_set1_ps(1.f);
        __m256 _alpha256 = _mm256_set1_ps(alpha);
        __m256 _lambda256 = _mm256_set1_ps(lambda);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);

            __m256 _pos = _mm256_max_ps(_zero256, _p);
            __m256 _neg = _mm256_min_ps(_zero256, _p);

            __m256 _blob = exp256_ps(_neg);
            _blob = _mm256_sub_ps(_blob, _one256);
            _blob = _mm256_mul_ps(_alpha256, _blob);
            _blob = _mm256_mul_ps(_lambda256, _mm256_add_ps(_pos, _blob));

            _mm256_storeu_ps(ptr, _blob);

            ptr += 8;
        }
#endif // __AVX__
        __m128 _zero128 = _mm_setzero_ps();
        __m128 _one128 = _mm_set1_ps(1.f);
        __m128 _alpha128 = _mm_set1_ps(alpha);
        __m128 _lambda128 = _mm_set1_ps(lambda);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);

            __m128 _pos = _mm_max_ps(_zero128, _p);
            __m128 _neg = _mm_min_ps(_zero128, _p);

            __m128 _blob = exp_ps(_neg);
            _blob = _mm_sub_ps(_blob, _one128);
            _blob = _mm_mul_ps(_alpha128, _blob);
            _blob = _mm_mul_ps(_lambda128, _mm_add_ps(_pos, _blob));

            _mm_storeu_ps(ptr, _blob);

            ptr += 4;
        }
#endif // __SSE2__
        float alphaxlambda = alpha * lambda;
        for (; i < size; i++)
        {
            // y = lambda * ( max(0, x) + min(0, alpha * (exp(x) - 1)) )
            if (*ptr < 0)
                *ptr = (expf(*ptr) - 1.f) * alphaxlambda;
            else
                *ptr = *ptr * lambda;
            ptr++;
        }
    }

    return 0;
}